

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::fix_newlines(string *leader,string *input)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_type n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_10 = in_RSI;
  while( true ) {
    uVar3 = false;
    if (local_20 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      in_stack_ffffffffffffff28 = local_20;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (in_RDX);
      uVar3 = in_stack_ffffffffffffff28 < pbVar1;
    }
    if ((bool)uVar3 == false) break;
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f,
                          (size_type)in_stack_ffffffffffffff50);
    if (local_20 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      pbVar1 = local_80;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_RDX,CONCAT17(uVar3,in_stack_ffffffffffffff30),
                 (size_type)in_stack_ffffffffffffff28);
      ::std::operator+(in_stack_ffffffffffffff28,pbVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_RDX,CONCAT17(uVar3,in_stack_ffffffffffffff30),
                 (size_type)in_stack_ffffffffffffff28);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      ::std::__cxx11::string::~string(pbVar1);
      ::std::__cxx11::string::~string(pbVar1);
      ::std::__cxx11::string::~string(pbVar1);
      ::std::__cxx11::string::~string(pbVar1);
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_10);
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(local_20->_M_dataplus)._M_p + sVar2);
    }
  }
  ::std::__cxx11::string::string
            (in_stack_ffffffffffffff60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}